

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop.cpp
# Opt level: O2

int __thiscall ncnn::BinaryOp::forward_inplace(BinaryOp *this,Mat *bottom_top_blob)

{
  float fVar1;
  void *pvVar2;
  int i;
  ulong uVar3;
  int i_7;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  float fVar9;
  Mat local_60;
  
  switch(this->op_type) {
  case 0:
    fVar1 = this->b;
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar3 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar3;
    }
    iVar6 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      iVar6 = 0;
    }
    while (iVar7 = (int)uVar3, iVar7 != iVar6) {
      Mat::channel(&local_60,bottom_top_blob,iVar7);
      pvVar2 = local_60.data;
      Mat::~Mat(&local_60);
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        *(float *)((long)pvVar2 + uVar3 * 4) = *(float *)((long)pvVar2 + uVar3 * 4) + fVar1;
      }
      uVar3 = (ulong)(iVar7 + 1);
    }
    break;
  case 1:
    fVar1 = this->b;
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar3 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar3;
    }
    iVar6 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      iVar6 = 0;
    }
    while (iVar7 = (int)uVar3, iVar7 != iVar6) {
      Mat::channel(&local_60,bottom_top_blob,iVar7);
      pvVar2 = local_60.data;
      Mat::~Mat(&local_60);
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        *(float *)((long)pvVar2 + uVar3 * 4) = *(float *)((long)pvVar2 + uVar3 * 4) - fVar1;
      }
      uVar3 = (ulong)(iVar7 + 1);
    }
    break;
  case 2:
    fVar1 = this->b;
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar3 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar3;
    }
    iVar6 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      iVar6 = 0;
    }
    while (iVar7 = (int)uVar3, iVar7 != iVar6) {
      Mat::channel(&local_60,bottom_top_blob,iVar7);
      pvVar2 = local_60.data;
      Mat::~Mat(&local_60);
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        *(float *)((long)pvVar2 + uVar3 * 4) = *(float *)((long)pvVar2 + uVar3 * 4) * fVar1;
      }
      uVar3 = (ulong)(iVar7 + 1);
    }
    break;
  case 3:
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar3 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar3;
    }
    iVar6 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      iVar6 = 0;
    }
    fVar1 = this->b;
    while (iVar7 = (int)uVar3, iVar7 != iVar6) {
      Mat::channel(&local_60,bottom_top_blob,iVar7);
      pvVar2 = local_60.data;
      Mat::~Mat(&local_60);
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        *(float *)((long)pvVar2 + uVar3 * 4) = *(float *)((long)pvVar2 + uVar3 * 4) * (1.0 / fVar1);
      }
      uVar3 = (ulong)(iVar7 + 1);
    }
    break;
  case 4:
    fVar1 = this->b;
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar3 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar3;
    }
    iVar6 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      iVar6 = 0;
    }
    while (iVar7 = (int)uVar3, iVar7 != iVar6) {
      Mat::channel(&local_60,bottom_top_blob,iVar7);
      pvVar2 = local_60.data;
      Mat::~Mat(&local_60);
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        fVar9 = *(float *)((long)pvVar2 + uVar3 * 4);
        if (fVar9 <= fVar1) {
          fVar9 = fVar1;
        }
        *(float *)((long)pvVar2 + uVar3 * 4) = fVar9;
      }
      uVar3 = (ulong)(iVar7 + 1);
    }
    break;
  case 5:
    fVar1 = this->b;
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar3 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar3;
    }
    iVar6 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      iVar6 = 0;
    }
    while (iVar7 = (int)uVar3, iVar7 != iVar6) {
      Mat::channel(&local_60,bottom_top_blob,iVar7);
      pvVar2 = local_60.data;
      Mat::~Mat(&local_60);
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        fVar9 = *(float *)((long)pvVar2 + uVar3 * 4);
        if (fVar1 <= fVar9) {
          fVar9 = fVar1;
        }
        *(float *)((long)pvVar2 + uVar3 * 4) = fVar9;
      }
      uVar3 = (ulong)(iVar7 + 1);
    }
    break;
  case 6:
    fVar1 = this->b;
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar3 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar3;
    }
    uVar8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar8 = uVar3;
    }
    while (iVar6 = (int)uVar3, iVar6 != (int)uVar8) {
      Mat::channel(&local_60,bottom_top_blob,iVar6);
      pvVar2 = local_60.data;
      Mat::~Mat(&local_60);
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        fVar9 = powf(*(float *)((long)pvVar2 + uVar3 * 4),fVar1);
        *(float *)((long)pvVar2 + uVar3 * 4) = fVar9;
      }
      uVar3 = (ulong)(iVar6 + 1);
    }
    break;
  case 7:
    fVar1 = this->b;
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar3 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar3;
    }
    iVar6 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      iVar6 = 0;
    }
    while (iVar7 = (int)uVar3, iVar7 != iVar6) {
      Mat::channel(&local_60,bottom_top_blob,iVar7);
      pvVar2 = local_60.data;
      Mat::~Mat(&local_60);
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        *(float *)((long)pvVar2 + uVar3 * 4) = fVar1 - *(float *)((long)pvVar2 + uVar3 * 4);
      }
      uVar3 = (ulong)(iVar7 + 1);
    }
    break;
  case 8:
    fVar1 = this->b;
    uVar4 = bottom_top_blob->h * bottom_top_blob->w;
    uVar3 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar3;
    }
    iVar6 = bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      iVar6 = 0;
    }
    while (iVar7 = (int)uVar3, iVar7 != iVar6) {
      Mat::channel(&local_60,bottom_top_blob,iVar7);
      pvVar2 = local_60.data;
      Mat::~Mat(&local_60);
      for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
        *(float *)((long)pvVar2 + uVar3 * 4) = fVar1 / *(float *)((long)pvVar2 + uVar3 * 4);
      }
      uVar3 = (ulong)(iVar7 + 1);
    }
  }
  return 0;
}

Assistant:

int BinaryOp::forward_inplace(Mat& bottom_top_blob) const
{
    if (op_type == Operation_ADD)
        return binary_op_scalar_inplace< std::plus<float> >(bottom_top_blob, b);

    if (op_type == Operation_SUB)
        return binary_op_scalar_inplace< std::minus<float> >(bottom_top_blob, b);

    if (op_type == Operation_MUL)
        return binary_op_scalar_inplace< std::multiplies<float> >(bottom_top_blob, b);

    if (op_type == Operation_DIV)
        return binary_op_scalar_inplace< std::divides<float> >(bottom_top_blob, b);

    if (op_type == Operation_MAX)
        return binary_op_scalar_inplace< binary_op_max<float> >(bottom_top_blob, b);

    if (op_type == Operation_MIN)
        return binary_op_scalar_inplace< binary_op_min<float> >(bottom_top_blob, b);

    if (op_type == Operation_POW)
        return binary_op_scalar_inplace< binary_op_pow<float> >(bottom_top_blob, b);

    if (op_type == Operation_RSUB)
        return binary_op_scalar_inplace< binary_op_rsub<float> >(bottom_top_blob, b);

    if (op_type == Operation_RDIV)
        return binary_op_scalar_inplace< binary_op_rdiv<float> >(bottom_top_blob, b);

    return 0;
}